

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x_pigpio.c
# Opt level: O2

void ta(void)

{
  int iVar1;
  int iVar2;
  uint got;
  char text [2048];
  
  puts("Serial link tests.");
  iVar1 = serOpen("/dev/ttyAMA0",0xe100,0);
  CHECK(10,1,iVar1,0,0,"serial open");
  serRead(iVar1,text,0x800);
  iVar2 = serDataAvailable(iVar1);
  CHECK(10,2,iVar2,0,0,"serial data available");
  iVar2 = serWrite(iVar1,
                   "To be, or not to be, that is the question-Whether \'tis Nobler in the mind to sufferThe Slings and Arrows of outrageous Fortune,Or to take Arms against a Sea of troubles,"
                   ,0xa9);
  CHECK(10,3,iVar2,0,0,"serial write");
  serWriteByte(iVar1,0xaa);
  serWriteByte(iVar1,0x55);
  serWriteByte(iVar1,0);
  iVar2 = serWriteByte(iVar1,0xff);
  CHECK(10,4,iVar2,0,0,"serial write byte");
  time_sleep(0x3fb999999999999a);
  iVar2 = serDataAvailable(iVar1);
  CHECK(10,5,iVar2,0xad,0,"serial data available");
  got = serRead(iVar1,text,0xa9);
  CHECK(10,6,got,0xa9,0,"serial read");
  if (-1 < (int)got) {
    text[got] = '\0';
  }
  iVar2 = strcmp("To be, or not to be, that is the question-Whether \'tis Nobler in the mind to sufferThe Slings and Arrows of outrageous Fortune,Or to take Arms against a Sea of troubles,"
                 ,text);
  CHECK(10,7,iVar2,0,0,"serial read");
  iVar2 = serReadByte(iVar1);
  CHECK(10,8,iVar2,0xaa,0,"serial read byte");
  iVar2 = serReadByte(iVar1);
  CHECK(10,9,iVar2,0x55,0,"serial read byte");
  iVar2 = serReadByte(iVar1);
  CHECK(10,10,iVar2,0,0,"serial read byte");
  iVar2 = serReadByte(iVar1);
  CHECK(10,0xb,iVar2,0xff,0,"serial read byte");
  iVar2 = serDataAvailable(iVar1);
  CHECK(10,0xc,iVar2,0,0,"serial data availabe");
  iVar1 = serClose(iVar1);
  CHECK(10,0xd,iVar1,0,0,"serial close");
  return;
}

Assistant:

void ta()
{
   int h, b, e;
   char *TEXT;
   char text[2048];

   printf("Serial link tests.\n");

   /* this test needs RXD and TXD to be connected */

   h = serOpen("/dev/ttyAMA0", 57600, 0);

   CHECK(10, 1, h, 0, 0, "serial open");

   b = serRead(h, text, sizeof(text)); /* flush buffer */

   b = serDataAvailable(h);
   CHECK(10, 2, b, 0, 0, "serial data available");

   TEXT = "\
To be, or not to be, that is the question-\
Whether 'tis Nobler in the mind to suffer\
The Slings and Arrows of outrageous Fortune,\
Or to take Arms against a Sea of troubles,\
";
   e = serWrite(h, TEXT, strlen(TEXT));
   CHECK(10, 3, e, 0, 0, "serial write");

   e = serWriteByte(h, 0xAA);
   e = serWriteByte(h, 0x55);
   e = serWriteByte(h, 0x00);
   e = serWriteByte(h, 0xFF);

   CHECK(10, 4, e, 0, 0, "serial write byte");

   time_sleep(0.1); /* allow time for transmission */

   b = serDataAvailable(h);
   CHECK(10, 5, b, strlen(TEXT)+4, 0, "serial data available");

   b = serRead(h, text, strlen(TEXT));
   CHECK(10, 6, b, strlen(TEXT), 0, "serial read");
   if (b >= 0) text[b] = 0;
   CHECK(10, 7, strcmp(TEXT, text), 0, 0, "serial read");

   b = serReadByte(h);
   CHECK(10, 8, b, 0xAA, 0, "serial read byte");

   b = serReadByte(h);
   CHECK(10, 9, b, 0x55, 0, "serial read byte");

   b = serReadByte(h);
   CHECK(10, 10, b, 0x00, 0, "serial read byte");

   b = serReadByte(h);
   CHECK(10, 11, b, 0xFF, 0, "serial read byte");

   b = serDataAvailable(h);
   CHECK(10, 12, b, 0, 0, "serial data availabe");

   e = serClose(h);
   CHECK(10, 13, e, 0, 0, "serial close");
}